

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void clear_refine(saucy *s)

{
  int local_14;
  int i;
  saucy *s_local;
  
  for (local_14 = 0; local_14 < s->nninduce; local_14 = local_14 + 1) {
    s->indmark[s->ninduce[local_14]] = '\0';
  }
  for (local_14 = 0; local_14 < s->nsinduce; local_14 = local_14 + 1) {
    s->indmark[s->sinduce[local_14]] = '\0';
  }
  s->nsinduce = 0;
  s->nninduce = 0;
  return;
}

Assistant:

static void
clear_refine(struct saucy *s)
{
    int i;
    for (i = 0; i < s->nninduce; ++i) {
        s->indmark[s->ninduce[i]] = 0;
    }
    for (i = 0; i < s->nsinduce; ++i) {
        s->indmark[s->sinduce[i]] = 0;
    }
    s->nninduce = s->nsinduce = 0;
}